

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask30_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  
  auVar1 = *(undefined1 (*) [16])(in + 5);
  uVar2 = in[0xf];
  auVar8 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_001901f0);
  auVar5 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_0019dc00);
  auVar4 = vpshufd_avx(auVar1,0xe9);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_00190210);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar8),ZEXT1632(auVar8),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT432(*in),1);
  auVar7 = vpbroadcastd_avx512vl();
  uVar3 = *(ulong *)(in + 0xd);
  auVar6 = vpblendd_avx2(auVar6,auVar7,0x20);
  auVar7._0_8_ = auVar4._0_8_;
  auVar7._8_8_ = auVar7._0_8_;
  auVar7._16_8_ = auVar7._0_8_;
  auVar7._24_8_ = auVar7._0_8_;
  auVar6 = vpblendd_avx2(auVar6,auVar7,0xc0);
  auVar6 = vpor_avx2(auVar5,auVar6);
  *(undefined1 (*) [32])out = auVar6;
  auVar4 = *(undefined1 (*) [16])(in + 9);
  auVar8 = vpsllvd_avx2(auVar4,_DAT_00192080);
  auVar1 = vpalignr_avx(auVar4,auVar1,0xc);
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_00190a20);
  auVar1 = vpor_avx(auVar8,auVar1);
  *(undefined1 (*) [16])(out + 8) = auVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar1 = vpalignr_avx(auVar8,auVar4,0xc);
  auVar4 = vpsrlvd_avx2(auVar1,_DAT_0019cde0);
  auVar1 = vpsllvd_avx2(auVar8,_DAT_001902e0);
  auVar1 = vpor_avx(auVar1,auVar4);
  *(long *)(out + 0xc) = auVar1._0_8_;
  out[0xe] = uVar2 << 2 | (uint)(uVar3 >> 0x3c);
  return out + 0xf;
}

Assistant:

uint32_t *__fastpackwithoutmask30_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (30 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (30 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (30 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (30 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (30 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (30 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (30 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (30 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (30 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (30 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (30 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (30 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (30 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (30 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++out;
  ++in;

  return out;
}